

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  uint __val;
  PyTypeObject *pPVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  handle *handle;
  PyObject *pPVar6;
  long *plVar7;
  long *plVar8;
  undefined8 *puVar9;
  PyTypeObject *pPVar10;
  char *pcVar11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  size_type *psVar15;
  undefined8 uVar16;
  string *in_RDI;
  uint __len;
  size_type __dnew;
  string __str;
  error_scope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [24];
  handle hStack_150;
  string *local_148;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110 [2];
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  error_scope local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  handle local_60;
  handle local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar5 = PyErr_Occurred();
  if (lVar5 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_188._M_dataplus._M_p = (pointer)0x1f;
    pcVar11 = (char *)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_188);
    (in_RDI->_M_dataplus)._M_p = pcVar11;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
    builtin_strncpy(pcVar11,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_188._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(&local_c0,&local_c0.value,&local_c0.trace);
    local_68 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_68;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_148 = in_RDI;
    if (local_c0.type != (PyObject *)0x0) {
      local_168._8_8_ = local_c0.type;
      local_168._16_8_ = "__name__";
      hStack_150.m_ptr = (PyObject *)0x0;
      handle = &accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_168)->
                super_handle;
      cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_188,handle);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      object::~object((object *)&hStack_150);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_c0.value != (PyObject *)0x0) {
      str::str((str *)local_168,(handle)local_c0.value);
      str::operator_cast_to_string(&local_188,(str *)local_168);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      object::~object((object *)local_168);
    }
    PyErr_NormalizeException(&local_c0,&local_c0.value,&local_c0.trace);
    if (local_c0.trace != (PyObject *)0x0) {
      PyException_SetTraceback(local_c0.value);
    }
    if (local_c0.trace != (PyObject *)0x0) {
      do {
        pPVar6 = local_c0.trace;
        local_c0.trace = (PyObject *)pPVar6[1].ob_refcnt;
      } while (local_c0.trace != (PyObject *)0x0);
      pPVar10 = pPVar6[1].ob_type;
      if (pPVar10 != (PyTypeObject *)0x0) {
        (pPVar10->ob_base).ob_base.ob_refcnt = (pPVar10->ob_base).ob_base.ob_refcnt + 1;
      }
      std::__cxx11::string::append((char *)in_RDI);
      while (pPVar1 = pPVar10, pPVar1 != (PyTypeObject *)0x0) {
        plVar7 = (long *)PyFrame_GetCode(pPVar1);
        uVar3 = PyFrame_GetLineNumber(pPVar1);
        local_58.m_ptr = (PyObject *)plVar7[0xd];
        cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_50,&local_58);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x11652a);
        local_88 = &local_78;
        plVar12 = plVar8 + 2;
        if ((long *)*plVar8 == plVar12) {
          local_78 = *plVar12;
          lStack_70 = plVar8[3];
        }
        else {
          local_78 = *plVar12;
          local_88 = (long *)*plVar8;
        }
        local_80 = plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_100 = &local_f0;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_f0 = *puVar13;
          lStack_e8 = plVar8[3];
        }
        else {
          local_f0 = *puVar13;
          local_100 = (ulong *)*plVar8;
        }
        local_f8 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        __val = -uVar3;
        if (0 < (int)uVar3) {
          __val = uVar3;
        }
        __len = 1;
        if (9 < __val) {
          uVar14 = (ulong)__val;
          uVar2 = 4;
          do {
            __len = uVar2;
            uVar4 = (uint)uVar14;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_00109f3e;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_00109f3e;
            }
            if (uVar4 < 10000) goto LAB_00109f3e;
            uVar14 = uVar14 / 10000;
            uVar2 = __len + 4;
          } while (99999 < uVar4);
          __len = __len + 1;
        }
LAB_00109f3e:
        local_120 = local_110;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_120,(char)__len - (char)((int)uVar3 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_120),__len,__val);
        in_RDI = local_148;
        uVar14 = 0xf;
        if (local_100 != &local_f0) {
          uVar14 = local_f0;
        }
        if (uVar14 < (ulong)(local_118 + local_f8)) {
          uVar14 = 0xf;
          if (local_120 != local_110) {
            uVar14 = local_110[0];
          }
          if (uVar14 < (ulong)(local_118 + local_f8)) goto LAB_00109fc9;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_100);
        }
        else {
LAB_00109fc9:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_120);
        }
        local_140 = &local_130;
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_130 = *plVar8;
          uStack_128 = puVar9[3];
        }
        else {
          local_130 = *plVar8;
          local_140 = (long *)*puVar9;
        }
        local_138 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)plVar8 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_e0 = &local_d0;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_d0 = *puVar13;
          lStack_c8 = plVar8[3];
        }
        else {
          local_d0 = *puVar13;
          local_e0 = (ulong *)*plVar8;
        }
        local_d8 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_60.m_ptr = (PyObject *)plVar7[0xe];
        cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_a8,&local_60);
        uVar14 = 0xf;
        if (local_e0 != &local_d0) {
          uVar14 = local_d0;
        }
        if (uVar14 < local_a8._M_string_length + local_d8) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            uVar16 = local_a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_a8._M_string_length + local_d8) goto LAB_0010a11a;
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_a8,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_0010a11a:
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_e0,(ulong)local_a8._M_dataplus._M_p);
        }
        local_168._0_8_ = local_168 + 0x10;
        pPVar6 = (PyObject *)(plVar8 + 2);
        if ((PyObject *)*plVar8 == pPVar6) {
          local_168._16_8_ = pPVar6->ob_refcnt;
          hStack_150.m_ptr = (PyObject *)plVar8[3];
        }
        else {
          local_168._16_8_ = pPVar6->ob_refcnt;
          local_168._0_8_ = (PyObject *)*plVar8;
        }
        local_168._8_8_ = plVar8[1];
        *plVar8 = (long)pPVar6;
        plVar8[1] = 0;
        *(undefined1 *)&pPVar6->ob_refcnt = 0;
        plVar8 = (long *)std::__cxx11::string::append(local_168);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_188.field_2._M_allocated_capacity = *psVar15;
          local_188.field_2._8_8_ = plVar8[3];
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar15;
          local_188._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_188._M_string_length = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((PyObject *)local_168._0_8_ != (PyObject *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if (local_120 != local_110) {
          operator_delete(local_120,local_110[0] + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          _Py_Dealloc(plVar7);
        }
        pPVar10 = (PyTypeObject *)PyFrame_GetBack(pPVar1);
        (pPVar1->ob_base).ob_base.ob_refcnt = (pPVar1->ob_base).ob_base.ob_refcnt + -1;
        if ((pPVar1->ob_base).ob_base.ob_refcnt == 0) {
          _Py_Dealloc(pPVar1);
        }
      }
    }
    error_scope::~error_scope(&local_c0);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value) {
        errorString += (std::string) str(scope.value);
    }

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr) {
        PyException_SetTraceback(scope.value, scope.trace);
    }
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        auto *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next) {
            trace = trace->tb_next;
        }

        PyFrameObject *frame = trace->tb_frame;
        Py_XINCREF(frame);
        errorString += "\n\nAt:\n";
        while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
            PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
            PyCodeObject *f_code = frame->f_code;
            Py_INCREF(f_code);
#    endif
            int lineno = PyFrame_GetLineNumber(frame);
            errorString += "  " + handle(f_code->co_filename).cast<std::string>() + "("
                           + std::to_string(lineno)
                           + "): " + handle(f_code->co_name).cast<std::string>() + "\n";
            Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
            auto *b_frame = PyFrame_GetBack(frame);
#    else
            auto *b_frame = frame->f_back;
            Py_XINCREF(b_frame);
#    endif
            Py_DECREF(frame);
            frame = b_frame;
        }
    }
#endif

    return errorString;
}